

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5MultiIterAdvanceRowid(Fts5Iter *pIter,int iChanged,Fts5SegIter **ppFirst)

{
  i64 iVar1;
  Fts5CResult *pRes;
  Fts5SegIter *pOther;
  Fts5SegIter *pFStack_30;
  int i;
  Fts5SegIter *pNew;
  Fts5SegIter **ppFirst_local;
  int iChanged_local;
  Fts5Iter *pIter_local;
  
  pFStack_30 = pIter->aSeg + iChanged;
  if ((pFStack_30->iRowid == pIter->iSwitchRowid) ||
     ((uint)(pFStack_30->iRowid < pIter->iSwitchRowid) == pIter->bRev)) {
    pRes = (Fts5CResult *)(pIter->aSeg + (int)(iChanged ^ 1));
    iVar1 = 0x7fffffffffffffff;
    if (pIter->bRev != 0) {
      iVar1 = -0x8000000000000000;
    }
    pIter->iSwitchRowid = iVar1;
    pOther._4_4_ = pIter->nSeg + iChanged;
    while( true ) {
      pOther._4_4_ = (int)pOther._4_4_ / 2;
      if (pIter->aFirst[(int)pOther._4_4_].bTermEq != '\0') {
        if (pFStack_30->iRowid == *(long *)(pRes + 0x1a)) {
          return 1;
        }
        if ((uint)(pFStack_30->iRowid < *(long *)(pRes + 0x1a)) == pIter->bRev) {
          pIter->iSwitchRowid = *(i64 *)(pRes + 0x1a);
          pFStack_30 = (Fts5SegIter *)pRes;
        }
        else if ((uint)(pIter->iSwitchRowid < *(long *)(pRes + 0x1a)) == pIter->bRev) {
          pIter->iSwitchRowid = *(i64 *)(pRes + 0x1a);
        }
      }
      pIter->aFirst[(int)pOther._4_4_].iFirst = (u16)(((long)pFStack_30 - (long)pIter->aSeg) / 0x78)
      ;
      if (pOther._4_4_ == 1) break;
      pRes = (Fts5CResult *)(pIter->aSeg + pIter->aFirst[(int)(pOther._4_4_ ^ 1)].iFirst);
    }
  }
  *ppFirst = pFStack_30;
  return 0;
}

Assistant:

static int fts5MultiIterAdvanceRowid(
  Fts5Iter *pIter,                /* Iterator to update aFirst[] array for */
  int iChanged,                   /* Index of sub-iterator just advanced */
  Fts5SegIter **ppFirst
){
  Fts5SegIter *pNew = &pIter->aSeg[iChanged];

  if( pNew->iRowid==pIter->iSwitchRowid
   || (pNew->iRowid<pIter->iSwitchRowid)==pIter->bRev
  ){
    int i;
    Fts5SegIter *pOther = &pIter->aSeg[iChanged ^ 0x0001];
    pIter->iSwitchRowid = pIter->bRev ? SMALLEST_INT64 : LARGEST_INT64;
    for(i=(pIter->nSeg+iChanged)/2; 1; i=i/2){
      Fts5CResult *pRes = &pIter->aFirst[i];

      assert( pNew->pLeaf );
      assert( pRes->bTermEq==0 || pOther->pLeaf );

      if( pRes->bTermEq ){
        if( pNew->iRowid==pOther->iRowid ){
          return 1;
        }else if( (pOther->iRowid>pNew->iRowid)==pIter->bRev ){
          pIter->iSwitchRowid = pOther->iRowid;
          pNew = pOther;
        }else if( (pOther->iRowid>pIter->iSwitchRowid)==pIter->bRev ){
          pIter->iSwitchRowid = pOther->iRowid;
        }
      }
      pRes->iFirst = (u16)(pNew - pIter->aSeg);
      if( i==1 ) break;

      pOther = &pIter->aSeg[ pIter->aFirst[i ^ 0x0001].iFirst ];
    }
  }

  *ppFirst = pNew;
  return 0;
}